

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncCastEmulation.cpp
# Opt level: O2

Function * __thiscall
wasm::FuncCastEmulation::makeThunk(FuncCastEmulation *this,Name name,Module *module,Index numParams)

{
  Name name_00;
  Name name_01;
  Name target;
  Function *pFVar1;
  Type *pTVar2;
  LocalGet *value;
  Call *value_00;
  string *psVar3;
  Index IVar4;
  bool bVar5;
  Signature SVar6;
  Iterator IVar7;
  Name name_02;
  undefined1 auStack_258 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> callOperands;
  HeapType local_d0;
  Type local_c8;
  string *local_c0;
  Type local_b8;
  undefined1 local_b0 [8];
  Name thunk;
  Builder builder;
  undefined1 local_78 [8];
  Name name_local;
  vector<wasm::Type,_std::allocator<wasm::Type>_> thunkParams;
  __uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> local_38;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> thunkFunc;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  local_78 = name.super_IString.str._M_len;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name_local.super_IString.str._M_str,"byn$fpcast-emu$",
             (allocator<char> *)&thunk.super_IString.str._M_str);
  IString::toString_abi_cxx11_((string *)&builder,(IString *)local_78);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_258,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &name_local.super_IString.str._M_str,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&builder);
  IString::IString((IString *)local_b0,(string *)auStack_258);
  std::__cxx11::string::~string((string *)auStack_258);
  std::__cxx11::string::~string((string *)&builder);
  std::__cxx11::string::~string((string *)&name_local.super_IString.str._M_str);
  name_00.super_IString.str._M_str = (char *)thunk.super_IString.str._M_len;
  name_00.super_IString.str._M_len = (size_t)local_b0;
  pFVar1 = Module::getFunctionOrNull(module,name_00);
  if (pFVar1 == (Function *)0x0) {
    name_01.super_IString.str._M_str = (char *)name_local.super_IString.str._M_len;
    name_01.super_IString.str._M_len = (size_t)local_78;
    pFVar1 = Module::getFunction(module,name_01);
    SVar6 = HeapType::getSignature(&pFVar1->type);
    local_b8 = SVar6.results.id;
    auStack_258 = (undefined1  [8])0x0;
    callOperands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    callOperands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    thunk.super_IString.str._M_str = (char *)module;
    SVar6 = HeapType::getSignature(&pFVar1->type);
    builder.wasm = (Module *)SVar6.params.id;
    thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    name_local.super_IString.str._M_str = (char *)&builder;
    IVar7 = wasm::Type::end((Type *)&builder);
    local_c0 = (string *)
               IVar7.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
    IVar4 = 0;
    psVar3 = (string *)&builder;
    while ((thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (pointer)IVar7.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
           || (psVar3 != local_c0))) {
      pTVar2 = wasm::Type::Iterator::operator*((Iterator *)&name_local.super_IString.str._M_str);
      value = MixedArena::alloc<wasm::LocalGet>(&module->allocator);
      value->index = IVar4;
      (value->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 3;
      local_38._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
           (tuple<wasm::Function_*,_std::default_delete<wasm::Function>_>)
           fromABI((Expression *)value,(Type)pTVar2->id,module);
      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
      emplace_back<wasm::Expression*>
                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_258,
                 (Expression **)&local_38);
      thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)&(thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                             ._M_impl.super__Vector_impl_data._M_start)->id + 1);
      IVar4 = IVar4 + 1;
      psVar3 = (string *)name_local.super_IString.str._M_str;
    }
    target.super_IString.str._M_str = (char *)name_local.super_IString.str._M_len;
    target.super_IString.str._M_len = (size_t)local_78;
    value_00 = Builder::makeCall((Builder *)&thunk.super_IString.str._M_str,target,
                                 (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                                 auStack_258,local_b8,false);
    name_local.super_IString.str._M_str = (char *)0x0;
    while (bVar5 = numParams != 0, numParams = numParams - 1, bVar5) {
      builder.wasm = (Module *)0x3;
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::emplace_back<wasm::Type>
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)
                 &name_local.super_IString.str._M_str,(Type *)&builder);
    }
    wasm::Type::Type(&local_c8,(Tuple *)&name_local.super_IString.str._M_str);
    SVar6.results.id = 3;
    SVar6.params.id = local_c8.id;
    HeapType::HeapType(&local_d0,SVar6);
    builder.wasm = (Module *)0x0;
    toABI((Expression *)value_00,module);
    name_02.super_IString.str._M_str = (char *)local_b0;
    name_02.super_IString.str._M_len = (size_t)&local_38;
    Builder::makeFunction
              (name_02,(HeapType)thunk.super_IString.str._M_len,
               (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_d0.id,(Expression *)&builder
              );
    std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
              ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)&builder);
    ((Expression *)
    ((long)local_38._M_t.
           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
           super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x10))->_id = BlockId;
    pFVar1 = Module::addFunction(module,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                         *)&local_38);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
              ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&local_38);
    std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
              ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)
               &name_local.super_IString.str._M_str);
    std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
              ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_258)
    ;
    return pFVar1;
  }
  Fatal::Fatal((Fatal *)auStack_258);
  Fatal::operator<<((Fatal *)auStack_258,
                    (char (*) [103])
                    "FuncCastEmulation::makeThunk seems a thunk name already in use. Was the pass already run on this code?"
                   );
  Fatal::~Fatal((Fatal *)auStack_258);
}

Assistant:

Function* makeThunk(Name name, Module* module, Index numParams) {
    Name thunk = std::string("byn$fpcast-emu$") + name.toString();
    if (module->getFunctionOrNull(thunk)) {
      Fatal() << "FuncCastEmulation::makeThunk seems a thunk name already in "
                 "use. Was the pass already run on this code?";
    }
    // The item in the table may be a function or a function import.
    auto* func = module->getFunction(name);
    Type type = func->getResults();
    Builder builder(*module);
    std::vector<Expression*> callOperands;
    Index i = 0;
    for (const auto& param : func->getParams()) {
      callOperands.push_back(
        fromABI(builder.makeLocalGet(i++, Type::i64), param, module));
    }
    auto* call = builder.makeCall(name, callOperands, type);
    std::vector<Type> thunkParams;
    for (Index i = 0; i < numParams; i++) {
      thunkParams.push_back(Type::i64);
    }
    auto thunkFunc =
      builder.makeFunction(thunk,
                           Signature(Type(thunkParams), Type::i64),
                           {}, // no vars
                           toABI(call, module));
    thunkFunc->hasExplicitName = true;
    return module->addFunction(std::move(thunkFunc));
  }